

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

void __thiscall
VW::object_pool<example,_example_initializer>::object_pool
          (void *param_1,undefined8 param_2,undefined8 param_3)

{
  size_t in_stack_00000058;
  object_pool<example,_example_initializer> *in_stack_00000060;
  
  std::mutex::mutex((mutex *)0x146982);
  std::queue<example*,std::deque<example*,std::allocator<example*>>>::
  queue<std::deque<example*,std::allocator<example*>>,void>
            ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
             ((long)param_1 + 0x28));
  std::vector<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>::
  vector((vector<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
          *)0x1469a8);
  std::
  vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ::vector((vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
            *)0x1469be);
  *(undefined8 *)((long)param_1 + 0xb0) = param_2;
  *(undefined8 *)((long)param_1 + 0xb8) = param_3;
  new_chunk(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

object_pool(size_t initial_chunk_size, TInitializer initializer = {}, size_t chunk_size = 8)
    : m_initializer(initializer),
    m_initial_chunk_size(initial_chunk_size),
    m_chunk_size(chunk_size)
  {
    new_chunk(initial_chunk_size);
  }